

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTSoundBank_GetState(FACTSoundBank *pSoundBank,uint32_t *pdwState)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *pdwState = 0;
    uVar2 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    *pdwState = 4;
    uVar1 = pSoundBank->cueCount;
    if (uVar1 != 0) {
      puVar3 = &pSoundBank->cues->instanceCount;
      do {
        if (*puVar3 != '\0') {
          *pdwState = 0x84;
          break;
        }
        puVar3 = puVar3 + 0x14;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t FACTSoundBank_GetState(
	FACTSoundBank *pSoundBank,
	uint32_t *pdwState
) {
	uint16_t i;
	if (pSoundBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pSoundBank->cueCount; i += 1)
	{
		if (pSoundBank->cues[i].instanceCount > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pSoundBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}